

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPathEnum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int fVerbose;
  int fZddAlgo;
  int nSize;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 4;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"Nzvh");
      if (iVar2 == -1) {
        Abc_EnumerateFrontierTest(fVerbose);
        return 0;
      }
      if (iVar2 == 0x4e) break;
      if (iVar2 == 0x68) goto LAB_0028ca5f;
      if (iVar2 == 0x76) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar2 != 0x7a) {
        Abc_Print(-2,"Unknown switch.\n");
        goto LAB_0028ca5f;
      }
    }
    if (argc <= globalUtilOptind) break;
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fVerbose < 0) {
LAB_0028ca5f:
      Abc_Print(-2,"usage: pathenum [-N num] [-vh]\n");
      Abc_Print(-2,"\t         enumerates self-avoiding paths on the NxN grid\n");
      Abc_Print(-2,"\t-N num : the size of the grid to consider [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0028ca5f;
}

Assistant:

int Abc_CommandPathEnum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_EnumerateFrontierTest( int nSize );
    int c, nSize = 4, fZddAlgo = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSize < 0 )
                goto usage;
            break;
        case 'z':
            fZddAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    Abc_EnumerateFrontierTest( nSize );
    return 0;

usage:
    Abc_Print( -2, "usage: pathenum [-N num] [-vh]\n" );
    Abc_Print( -2, "\t         enumerates self-avoiding paths on the NxN grid\n" );
    Abc_Print( -2, "\t-N num : the size of the grid to consider [default = %d]\n", nSize );
//    Abc_Print( -2, "\t-z     : toggle using ZDD-based algorithm [default = %s]\n", fZddAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}